

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_relay.cpp
# Opt level: O0

void __thiscall TCPRelay::HandleEvent(TCPRelay *this,SOCKET s,int event)

{
  int iVar1;
  Log *pLVar2;
  TCPRelayHandler *this_00;
  size_type sVar3;
  mapped_type *ppIVar4;
  SOCKET new_socket;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  uint local_18;
  uint local_14;
  int event_local;
  SOCKET s_local;
  TCPRelay *this_local;
  
  local_18 = event;
  local_14 = s;
  _event_local = this;
  if (s == -1) {
    pLVar2 = Log::GetInstance();
    pLVar2 = Log::operator<<(pLVar2,yellow);
    Log::FormatTime_abi_cxx11_();
    pLVar2 = Log::operator<<(pLVar2,&local_38);
    pLVar2 = Log::operator<<(pLVar2,(char (*) [12])" [warning] ");
    Log::operator<<(pLVar2,(char (*) [16])"invalid socket\n");
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if (s == this->server_socket_) {
    if ((event & 8U) == 0) {
      iVar1 = accept(this->server_socket_,(sockaddr *)0x0,(socklen_t *)0x0);
      if (iVar1 != -1) {
        this_00 = (TCPRelayHandler *)operator_new(0xd0);
        TCPRelayHandler::TCPRelayHandler
                  (this_00,this,this->event_loop_,this->dns_resolver_,iVar1,this->config_,
                   (bool)(this->is_local_ & 1));
      }
    }
    else {
      EventLoop::Stop(this->event_loop_);
    }
  }
  else {
    sVar3 = std::
            map<int,_ISockNotify_*,_std::less<int>,_std::allocator<std::pair<const_int,_ISockNotify_*>_>_>
            ::count(&this->socket_handler_,(key_type_conflict *)&local_14);
    if (sVar3 != 0) {
      ppIVar4 = std::
                map<int,_ISockNotify_*,_std::less<int>,_std::allocator<std::pair<const_int,_ISockNotify_*>_>_>
                ::operator[](&this->socket_handler_,(key_type_conflict *)&local_14);
      (*(*ppIVar4)->_vptr_ISockNotify[2])(*ppIVar4,(ulong)local_14,(ulong)local_18);
    }
  }
  return;
}

Assistant:

void TCPRelay::HandleEvent(SOCKET s, int event)
{
    if (s == INVALID_SOCKET)
    {
        LOGW << "invalid socket\n";
        return;
    }
    if (s == server_socket_)
    {
        if (event & kPollErr)
        {
            event_loop_->Stop();
            return;
        }
        SOCKET new_socket = accept(server_socket_, NULL, NULL);
        if (new_socket != INVALID_SOCKET)
        {
            new TCPRelayHandler(this, event_loop_, dns_resolver_, new_socket, config_, is_local_);
        }
    }
    else
    {
        if (socket_handler_.count(s) > 0)
        {
            socket_handler_[s]->HandleEvent(s, event);
        }
    }
}